

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t duckdb::ParquetCrypto::ReadData
                   (TProtocol *iprot,data_ptr_t buffer,uint32_t buffer_size,string *key,
                   EncryptionUtil *encryption_util_p)

{
  uint32_t uVar1;
  element_type *this;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_RCX;
  uint in_EDX;
  int in_ESI;
  size_t in_R8;
  DecryptionTransport *in_stack_00000020;
  DecryptionTransport *dtrans;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> dprot;
  TCompactProtocolFactoryT<duckdb::DecryptionTransport> tproto_factory;
  TProtocol *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EncryptionUtil *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TProtocol *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffe8;
  
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::
  TCompactProtocolFactoryT
            ((TCompactProtocolFactoryT<duckdb::DecryptionTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ::std::
  make_shared<duckdb::DecryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::
  shared_ptr<duckdb::DecryptionTransport,void>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (shared_ptr<duckdb::DecryptionTransport> *)in_stack_ffffffffffffff48);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::
  getProtocol((TCompactProtocolFactoryT<duckdb::DecryptionTransport> *)
              CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x2320ae6);
  ::std::shared_ptr<duckdb::DecryptionTransport>::~shared_ptr
            ((shared_ptr<duckdb::DecryptionTransport> *)0x2320af0);
  ::std::
  __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2320afa);
  duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff48);
  this = ::std::
         __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  ::std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x2320b27);
  duckdb_apache::thrift::transport::TTransport::read(this,in_ESI,(void *)(ulong)in_EDX,in_R8);
  uVar1 = DecryptionTransport::Finalize(in_stack_00000020);
  ::std::shared_ptr<duckdb_apache::thrift::protocol::TProtocol>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::protocol::TProtocol> *)0x2320b66);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::DecryptionTransport>::
  ~TCompactProtocolFactoryT((TCompactProtocolFactoryT<duckdb::DecryptionTransport> *)0x2320b73);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::ReadData(TProtocol &iprot, const data_ptr_t buffer, const uint32_t buffer_size,
                                 const string &key, const EncryptionUtil &encryption_util_p) {
	// Create decryption protocol
	TCompactProtocolFactoryT<DecryptionTransport> tproto_factory;
	auto dprot = tproto_factory.getProtocol(std::make_shared<DecryptionTransport>(iprot, key, encryption_util_p));
	auto &dtrans = reinterpret_cast<DecryptionTransport &>(*dprot->getTransport());

	// Read buffer
	dtrans.read(buffer, buffer_size);

	// Verify AES tag and read length
	return dtrans.Finalize();
}